

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

SiameseResult __thiscall
siamese::EncoderPacketWindow::Add(EncoderPacketWindow *this,SiameseOriginalPacket *packet)

{
  uint uVar1;
  value_type_conflict1 vVar2;
  LogStringBuffer *buffer_00;
  reference pvVar3;
  uint64_t uVar4;
  reference pvVar5;
  long lVar6;
  uint *in_RSI;
  long in_RDI;
  EncoderColumnLane *lane;
  uint laneIndex;
  uint originalBytes;
  OriginalPacket *original;
  EncoderSubwindow *subwindow;
  uint element;
  uint subwindowCount;
  uint column;
  uint newSize;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  char *in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  Allocator *in_stack_fffffffffffffa28;
  Allocator *in_stack_fffffffffffffa30;
  undefined8 *puVar7;
  LightVector<siamese::EncoderSubwindow_*,_25U> *in_stack_fffffffffffffa38;
  undefined1 *puVar8;
  LogStringBuffer *in_stack_fffffffffffffa58;
  EncoderPacketWindow *in_stack_fffffffffffffa60;
  OutputWorker *pOVar9;
  OutputWorker *this_00;
  EncoderSubwindow *local_558;
  uint local_54c;
  int local_548;
  uint local_544;
  uint *local_540;
  SiameseResult local_52c;
  long local_520;
  int local_514;
  EncoderSubwindow **local_510;
  long local_508;
  undefined1 local_4f9;
  char *local_4f8;
  undefined8 *local_4f0;
  uint local_4e4;
  char *local_4d8;
  undefined8 *local_4d0;
  uint local_4c4;
  uint local_4ac;
  long local_4a8;
  uint local_49c;
  long local_498;
  char *local_490;
  undefined4 local_484;
  undefined8 *local_480;
  undefined4 local_474;
  undefined8 *local_470;
  undefined1 local_458 [16];
  ostream aoStack_448 [376];
  char *local_2d0;
  undefined4 local_2c4;
  undefined8 *local_2c0;
  char *local_2b8;
  string *local_2b0;
  undefined1 *local_2a8;
  OutputWorker *local_2a0;
  string *local_298;
  undefined1 *local_290;
  OutputWorker *local_288;
  char *local_280;
  undefined1 *local_278;
  OutputWorker *local_270;
  string *local_268;
  undefined1 *local_260;
  char *local_258;
  undefined1 *local_250;
  char *local_248;
  undefined4 local_23c;
  undefined8 *local_238;
  undefined4 local_22c;
  undefined8 *local_228;
  undefined1 local_210 [392];
  char *local_88;
  undefined4 local_7c;
  undefined8 *local_78;
  char *local_70;
  string *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  string *local_50;
  undefined1 *local_48;
  undefined8 *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  if ((*(byte *)(in_RDI + 0x438) & 1) != 0) {
    return Siamese_Disabled;
  }
  if (*(int *)(in_RDI + 0x14) == 16000) {
    return Siamese_MaxPacketsReached;
  }
  local_544 = *(uint *)(in_RDI + 0x10);
  local_520 = in_RDI + 0x38;
  local_548 = *(int *)(in_RDI + 0x100);
  local_54c = *(uint *)(in_RDI + 0x14);
  *in_RSI = local_544;
  local_540 = in_RSI;
  if (local_54c + 8 < (uint)(local_548 << 6)) {
LAB_002496a7:
    if (*(int *)(in_RDI + 0x14) == 0) {
      local_54c = local_544 & 7;
      StartNewWindow(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20));
    }
    else {
      *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 1;
    }
    local_4e4 = local_54c;
    local_498 = in_RDI + 0x38;
    local_49c = local_54c >> 6;
    pvVar3 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                       ((array<siamese::OriginalPacket,_64UL> *)
                        CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        (size_type)in_stack_fffffffffffffa18);
    uVar1 = OriginalPacket::Initialize
                      ((OriginalPacket *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                       (SiameseOriginalPacket *)in_stack_fffffffffffffa28);
    if (uVar1 == 0) {
      *(undefined1 *)(in_RDI + 0x438) = 1;
      local_4d0 = &Logger;
      local_4d8 = "WindowAdd.Initialize OOM";
      local_238 = &Logger;
      local_23c = 4;
      local_248 = "WindowAdd.Initialize OOM";
      local_228 = &Logger;
      local_22c = 4;
      if (DAT_0034fe68 < 5) {
        local_78 = &Logger;
        local_7c = 4;
        local_88 = "WindowAdd.Initialize OOM";
        puVar7 = &Logger;
        puVar8 = local_210;
        logger::LogStringBuffer::LogStringBuffer
                  ((LogStringBuffer *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   in_stack_fffffffffffffa18,Trace);
        local_68 = (string *)(puVar7 + 7);
        local_70 = local_88;
        local_60 = puVar8;
        local_58 = puVar7;
        local_50 = local_68;
        local_48 = puVar8;
        local_40 = puVar7;
        local_38 = local_68;
        local_30 = puVar8;
        std::operator<<((ostream *)(puVar8 + 0x10),local_68);
        local_20 = local_60;
        local_28 = local_70;
        local_8 = local_60;
        local_10 = local_70;
        local_18 = puVar7;
        std::operator<<((ostream *)(local_60 + 0x10),local_70);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write
                  ((OutputWorker *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x2499e1);
      }
      local_52c = Siamese_Disabled;
    }
    else {
      uVar4 = GetTimeMsec();
      vVar2 = (value_type_conflict1)uVar4;
      local_4c4 = local_54c;
      local_4a8 = in_RDI + 0x38;
      local_4ac = local_54c >> 6;
      pvVar5 = std::array<unsigned_int,_64UL>::operator[]
                         ((array<unsigned_int,_64UL> *)CONCAT44(vVar2,in_stack_fffffffffffffa20),
                          (size_type)in_stack_fffffffffffffa18);
      *pvVar5 = vVar2;
      *(uint *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1U & 0x3fffff;
      uVar1 = (pvVar3->Buffer).Bytes;
      lVar6 = in_RDI + 0x118 + (ulong)(local_544 & 7) * 0x48;
      if (*(uint *)(lVar6 + 0x40) < uVar1) {
        *(uint *)(lVar6 + 0x40) = uVar1;
      }
      if (*(uint *)(in_RDI + 0x1c) < uVar1) {
        *(uint *)(in_RDI + 0x1c) = uVar1;
      }
      **(long **)(in_RDI + 8) = **(long **)(in_RDI + 8) + 1;
      *(ulong *)(*(long *)(in_RDI + 8) + 8) =
           (ulong)local_540[1] + *(long *)(*(long *)(in_RDI + 8) + 8);
      local_52c = Siamese_Success;
    }
  }
  else {
    local_558 = pktalloc::Allocator::Construct<siamese::EncoderSubwindow>(in_stack_fffffffffffffa28)
    ;
    if (local_558 != (EncoderSubwindow *)0x0) {
      local_508 = in_RDI + 0x38;
      local_510 = &local_558;
      local_514 = *(int *)(in_RDI + 0x100) + 1;
      local_4f9 = pktalloc::LightVector<siamese::EncoderSubwindow_*,_25U>::SetSize_Copy
                            (in_stack_fffffffffffffa38,
                             (uint)((ulong)in_stack_fffffffffffffa30 >> 0x20));
      if ((bool)local_4f9) {
        *(EncoderSubwindow **)(*(long *)(in_RDI + 0x108) + (ulong)(local_514 - 1) * 8) = *local_510;
        goto LAB_002496a7;
      }
    }
    *(undefined1 *)(in_RDI + 0x438) = 1;
    local_4f0 = &Logger;
    local_4f8 = "WindowAdd.Construct OOM";
    local_480 = &Logger;
    local_484 = 4;
    local_490 = "WindowAdd.Construct OOM";
    local_470 = &Logger;
    local_474 = 4;
    if (DAT_0034fe68 < 5) {
      local_2c0 = &Logger;
      local_2c4 = 4;
      local_2d0 = "WindowAdd.Construct OOM";
      pOVar9 = (OutputWorker *)&Logger;
      logger::LogStringBuffer::LogStringBuffer
                ((LogStringBuffer *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                 in_stack_fffffffffffffa18,Trace);
      local_2b0 = (string *)((pOVar9->QueueLock).super___mutex_base._M_mutex.__size + 0x10);
      local_2b8 = local_2d0;
      this_00 = pOVar9;
      local_2a8 = local_458;
      local_2a0 = pOVar9;
      local_298 = local_2b0;
      local_290 = local_458;
      local_288 = pOVar9;
      local_268 = local_2b0;
      local_260 = local_458;
      std::operator<<(aoStack_448,local_2b0);
      local_278 = local_2a8;
      local_280 = local_2b8;
      local_250 = local_2a8;
      local_258 = local_2b8;
      local_270 = pOVar9;
      std::operator<<((ostream *)(local_2a8 + 0x10),local_2b8);
      buffer_00 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_00,buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x249691);
    }
    local_52c = Siamese_Disabled;
  }
  return local_52c;
}

Assistant:

SiameseResult EncoderPacketWindow::Add(SiameseOriginalPacket& packet)
{
    if (EmergencyDisabled) {
        return Siamese_Disabled;
    }

    if (GetRemainingSlots() <= 0) {
        // This is not invalid input - The application often does not have
        // control over how much data it tries to send.  Instead it must
        // listen for our feedback return code to decide when to slow down.
        return Siamese_MaxPacketsReached;
    }

    const unsigned column         = NextColumn;
    const unsigned subwindowCount = Subwindows.GetSize();
    unsigned element              = Count;

    // Assign packet number
    packet.PacketNum = column;

    // If there is not enough room for this new element:
    // Note: Adding a buffer of kColumnLaneCount to create space ahead for
    // snapshots as a subwindow is filled and we need to store its snapshot
    if (element + kColumnLaneCount >= subwindowCount * kSubwindowSize)
    {
        EncoderSubwindow* subwindow = TheAllocator->Construct<EncoderSubwindow>();
        if (!subwindow || !Subwindows.Append(subwindow))
        {
            EmergencyDisabled = true;
            Logger.Error("WindowAdd.Construct OOM");
            SIAMESE_DEBUG_BREAK();
            return Siamese_Disabled;
        }
    }

    if (Count > 0) {
        ++Count;
    }
    else
    {
        // Start a new window:
        element = column % kColumnLaneCount;
        StartNewWindow(column);
    }

    // Initialize original packet with received data
    OriginalPacket* original = GetWindowElement(element);
    if (0 == original->Initialize(TheAllocator, packet))
    {
        EmergencyDisabled = true;
        Logger.Error("WindowAdd.Initialize OOM");
        SIAMESE_DEBUG_BREAK();
        return Siamese_Disabled;
    }
    SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == element % kColumnLaneCount);

    // Attach original send time in milliseconds
    *GetWindowElementTimestampPtr(element) = static_cast<uint32_t>(GetTimeMsec());

    // Roll next column to assign
    NextColumn = IncrementColumn1(NextColumn);

    // Update longest packet
    const unsigned originalBytes = original->Buffer.Bytes;
    const unsigned laneIndex     = column % kColumnLaneCount;
    EncoderColumnLane& lane      = Lanes[laneIndex];
    if (lane.LongestPacket < originalBytes) {
        lane.LongestPacket = originalBytes;
    }
    if (LongestPacket < originalBytes) {
        LongestPacket = originalBytes;
    }

    Stats->Counts[SiameseEncoderStats_OriginalCount]++;
    Stats->Counts[SiameseEncoderStats_OriginalBytes] += packet.DataBytes;
    return Siamese_Success;
}